

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_maddld(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 pTVar1;
  uint32_t uVar2;
  TCGv_i64 ret;
  TCGv_i64 t1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  uVar2 = rA(ctx->opcode);
  pTVar1 = cpu_gpr[uVar2];
  uVar2 = rB(ctx->opcode);
  tcg_gen_mul_i64_ppc64(tcg_ctx_00,ret,pTVar1,cpu_gpr[uVar2]);
  uVar2 = rD(ctx->opcode);
  pTVar1 = cpu_gpr[uVar2];
  uVar2 = rC(ctx->opcode);
  tcg_gen_add_i64(tcg_ctx_00,pTVar1,ret,cpu_gpr[uVar2]);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_maddld(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_mul_i64(tcg_ctx, t1, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_add_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t1, cpu_gpr[rC(ctx->opcode)]);
    tcg_temp_free_i64(tcg_ctx, t1);
}